

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorList.cpp
# Opt level: O0

void __thiscall Hpipe::Provenance::Provenance(Provenance *this,char *beg,char *pos)

{
  char *__end;
  char *__beg;
  bool bVar1;
  allocator<char> local_51;
  string local_50 [32];
  char *local_30;
  char *e;
  char *b;
  char *pos_local;
  char *beg_local;
  Provenance *this_local;
  
  b = pos;
  pos_local = beg;
  beg_local = (char *)this;
  std::__cxx11::string::string((string *)this);
  if (pos_local == (char *)0x0) {
    this->col = 0;
    this->line = 0;
  }
  else {
    e = b;
    local_30 = b;
    while( true ) {
      bVar1 = false;
      if ((pos_local <= e) && (bVar1 = false, *e != '\n')) {
        bVar1 = *e != '\r';
      }
      if (!bVar1) break;
      e = e + -1;
    }
    e = e + 1;
    while( true ) {
      __end = local_30;
      bVar1 = false;
      if ((*local_30 != '\0') && (bVar1 = false, *local_30 != '\n')) {
        bVar1 = *local_30 != '\r';
      }
      if (!bVar1) break;
      local_30 = local_30 + 1;
    }
    if (local_30 < e) {
      e = local_30;
    }
    __beg = e;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_50,__beg,__end,&local_51);
    std::__cxx11::string::operator=((string *)this,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    this->col = ((int)b - (int)e) + 1;
    this->line = 1;
    for (e = b; pos_local <= e; e = e + -1) {
      this->line = (uint)(*e == '\n') + this->line;
    }
  }
  return;
}

Assistant:

Provenance( const char *beg, const char *pos ) {
        if ( not beg ) {
            col  = 0;
            line = 0;
            return;
        }

        const char *b = pos, *e = pos;
        while ( b >= beg and *b != '\n' and *b != '\r' )
            --b;
        ++b;
        while ( *e and *e != '\n' and *e != '\r' )
            ++e;
        if ( b > e )
            b = e;

        complete_line = std::string( b, e );

        col = pos - b + 1;
        line = 1;
        for ( b = pos; b >= beg; --b )
            line += ( *b == '\n' );
    }